

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O3

void __thiscall
cppjieba::DictTrie::CalculateWeight
          (DictTrie *this,
          vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *node_infos,double sum)

{
  ulong uVar1;
  pointer pDVar2;
  long lVar3;
  double dVar4;
  
  if (sum <= 0.0) {
    __assert_fail("sum > 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/DictTrie.hpp"
                  ,0xfc,"void cppjieba::DictTrie::CalculateWeight(vector<DictUnit> &, double) const"
                 );
  }
  pDVar2 = (node_infos->super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if ((node_infos->super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>).
      _M_impl.super__Vector_impl_data._M_finish != pDVar2) {
    lVar3 = 0x58;
    uVar1 = 0;
    do {
      dVar4 = *(double *)((long)(pDVar2->word).buffer_ + lVar3);
      if (dVar4 <= 0.0) {
        __assert_fail("node_info.weight > 0.0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/DictTrie.hpp"
                      ,0xff,
                      "void cppjieba::DictTrie::CalculateWeight(vector<DictUnit> &, double) const");
      }
      dVar4 = log(dVar4 / sum);
      *(double *)((long)(pDVar2->word).buffer_ + lVar3) = dVar4;
      uVar1 = uVar1 + 1;
      pDVar2 = (node_infos->
               super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x80;
    } while (uVar1 < (ulong)((long)(node_infos->
                                   super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2 >> 7))
    ;
  }
  return;
}

Assistant:

void CalculateWeight(vector<DictUnit>& node_infos, double sum) const {
    assert(sum > 0.0);
    for (size_t i = 0; i < node_infos.size(); i++) {
      DictUnit& node_info = node_infos[i];
      assert(node_info.weight > 0.0);
      node_info.weight = log(double(node_info.weight)/sum);
    }
  }